

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roll-parser.cpp
# Opt level: O3

string * __thiscall
ORPG::ExpressionTree::tree_string
          (string *__return_storage_ptr__,ExpressionTree *this,parse_node *node,int indent,
          string *pre)

{
  undefined8 *puVar1;
  ulong uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  parse_node *ppVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  undefined8 uVar10;
  int iVar11;
  char *__end;
  string pad;
  string local_140;
  ExpressionTree *local_120;
  undefined8 *local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  ulong *local_f8;
  parse_node *local_f0;
  ulong local_e8;
  long lStack_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_120 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"","");
  local_d8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"","");
  if (0 < indent) {
    iVar11 = indent;
    do {
      std::__cxx11::string::append((char *)&local_b0);
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  std::operator+(&local_50,&local_b0,pre);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_e8 = *puVar7;
    lStack_e0 = plVar5[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *puVar7;
    local_f8 = (ulong *)*plVar5;
  }
  local_f0 = (parse_node *)plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  node_to_string_abi_cxx11_(&local_d0,(ORPG *)node,local_f0);
  uVar2 = (long)&local_f0->left + local_d0._M_string_length;
  uVar9 = 0xf;
  if (local_f8 != &local_e8) {
    uVar9 = local_e8;
  }
  if (uVar9 < uVar2) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar10 = local_d0.field_2._M_allocated_capacity;
    }
    if (uVar2 <= (ulong)uVar10) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_f8);
      goto LAB_0010301f;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_d0._M_dataplus._M_p);
LAB_0010301f:
  local_118 = &local_108;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_108 = *puVar1;
    uStack_100 = puVar6[3];
  }
  else {
    local_108 = *puVar1;
    local_118 = (undefined8 *)*puVar6;
  }
  local_110 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_118);
  paVar3 = &local_140.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_140.field_2._M_allocated_capacity = *psVar8;
    local_140.field_2._8_8_ = plVar5[3];
    local_140._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_140.field_2._M_allocated_capacity = *psVar8;
    local_140._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_140._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar3) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  ppVar4 = node->left;
  if (ppVar4 != (parse_node *)0x0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"left->","");
    tree_string(&local_140,local_120,ppVar4,indent + 2,&local_70);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_140._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar3) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  ppVar4 = node->right;
  if (ppVar4 != (parse_node *)0x0) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"right->","");
    tree_string(&local_140,local_120,ppVar4,indent + 2,&local_90);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_140._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar3) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string ExpressionTree::tree_string(struct parse_node* node, int indent, string pre) {
        int i;
        string pad("");
        string ret("");

        for(i = 0; i < indent; i++) pad += " ";

        ret = pad + pre + "(" + node_to_string(node) +")\n";

        if(node->left != NULL)  ret += tree_string(node->left, indent + 2, "left->");
        if(node->right != NULL) ret += tree_string(node->right, indent + 2, "right->");

        return ret;
    }